

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

void __thiscall
cfd::core::AbstractTxIn::AbstractTxIn
          (AbstractTxIn *this,Txid *txid,uint32_t index,uint32_t sequence)

{
  this->_vptr_AbstractTxIn = (_func_int **)&PTR__AbstractTxIn_0064d6b8;
  Txid::Txid(&this->txid_,txid);
  this->vout_ = index;
  Script::Script(&this->unlocking_script_);
  this->sequence_ = sequence;
  (this->script_witness_)._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00649518;
  (this->script_witness_).witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->script_witness_).witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->script_witness_).witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

AbstractTxIn::AbstractTxIn(const Txid &txid, uint32_t index, uint32_t sequence)
    : txid_(txid),
      vout_(index),
      unlocking_script_(),
      sequence_(sequence),
      script_witness_() {
  // do nothing
}